

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O1

void __thiscall kj::anon_unknown_8::DiskHandle::zero(DiskHandle *this,uint64_t offset,uint64_t size)

{
  Fault FVar1;
  int iVar2;
  uint uVar3;
  Exception *__iovec;
  ssize_t sVar4;
  Exception *pEVar5;
  size_t sVar6;
  ulong uVar7;
  Array<iovec> iov_heap;
  Fault f_1;
  Fault f_2;
  iovec iov_stack [16];
  Fault local_178;
  size_t sStack_170;
  undefined8 *local_168;
  Fault local_160;
  Fault local_158;
  undefined8 uStack_150;
  ulong local_148;
  ulong local_140;
  char *local_138;
  size_t sStack_130;
  
  do {
    iVar2 = fallocate((this->fd).fd,3,offset,size);
    if (-1 < iVar2) {
      iVar2 = 0;
      break;
    }
    iVar2 = kj::_::Debug::getOsErrorNumber(false);
  } while (iVar2 == -1);
  if (iVar2 != 0) {
    if (iVar2 == 0x5f) {
      uVar7 = size + 0xfff >> 0xc;
      sVar6 = 0x400;
      if (uVar7 < 0x400) {
        sVar6 = uVar7;
      }
      if (size + 0xfff < 0x11000) {
        local_178.exception = (Exception *)0x0;
        sStack_170 = 0;
        local_168 = (undefined8 *)0x0;
        __iovec = (Exception *)&stack0xfffffffffffffec8;
      }
      else {
        __iovec = (Exception *)
                  kj::_::HeapArrayDisposer::allocateImpl
                            (0x10,sVar6,sVar6,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
        ;
        local_168 = &kj::_::HeapArrayDisposer::instance;
        local_178.exception = __iovec;
        sStack_170 = sVar6;
      }
      if (sVar6 != 0) {
        pEVar5 = __iovec;
        do {
          (pEVar5->ownFile).content.ptr = (char *)"";
          (pEVar5->ownFile).content.size_ = 0x1000;
          pEVar5 = (Exception *)&(pEVar5->ownFile).content.disposer;
        } while (pEVar5 != (Exception *)(__iovec->trace + sVar6 * 2 + -10));
      }
      if (size != 0) {
        local_148 = sVar6 << 0xc;
        do {
          local_140 = size;
          if ((size < local_148) && ((size & 0xfff) != 0)) {
            *(uint64_t *)((long)__iovec->trace + ((size >> 8 & 0xfffffffffffffff0) - 0x48)) =
                 size & 0xfff;
          }
          do {
            sVar4 = pwritev((this->fd).fd,(iovec *)__iovec,(int)uVar7,offset);
            if (-1 < sVar4) {
              iVar2 = 0;
              break;
            }
            uVar3 = kj::_::Debug::getOsErrorNumber(false);
            size = size & 0xffffffff;
            if (uVar3 != 0xffffffff) {
              size = (uint64_t)uVar3;
            }
            iVar2 = (int)size;
          } while (uVar3 == 0xffffffff);
          if (iVar2 != 0) {
            local_160.exception = (Exception *)0x0;
            local_158.exception = (Exception *)0x0;
            uStack_150 = 0;
            kj::_::Debug::Fault::init
                      (&local_160,
                       (EVP_PKEY_CTX *)
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                      );
            kj::_::Debug::Fault::fatal(&local_160);
          }
          if (sVar4 < 1) {
            kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                      (&local_158,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                       ,0x1b0,FAILED,"n > 0","\"pwrite() returned zero?\"",
                       (char (*) [24])"pwrite() returned zero?");
            kj::_::Debug::Fault::fatal(&local_158);
          }
          offset = offset + sVar4;
          size = local_140 - sVar4;
        } while (size != 0);
      }
      sVar6 = sStack_170;
      FVar1.exception = local_178.exception;
      if (local_178.exception != (Exception *)0x0) {
        local_178.exception = (Exception *)0x0;
        sStack_170 = 0;
        (**(code **)*local_168)(local_168,FVar1.exception,0x10,sVar6,sVar6,0);
      }
    }
    else {
      local_178.exception = (Exception *)0x0;
      local_138 = (char *)0x0;
      sStack_130 = 0;
      kj::_::Debug::Fault::init
                (&local_178,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
                );
      kj::_::Debug::Fault::~Fault(&local_178);
    }
  }
  return;
}

Assistant:

void zero(uint64_t offset, uint64_t size) const {
#ifdef FALLOC_FL_PUNCH_HOLE
    KJ_SYSCALL_HANDLE_ERRORS(
        fallocate(fd, FALLOC_FL_PUNCH_HOLE | FALLOC_FL_KEEP_SIZE, offset, size)) {
      case EOPNOTSUPP:
        // fall back to below
        break;
      default:
        KJ_FAIL_SYSCALL("fallocate(FALLOC_FL_PUNCH_HOLE)", error) { return; }
    } else {
      return;
    }
#endif

    static const byte ZEROS[4096] = { 0 };

#if __APPLE__ || __CYGWIN__ || (defined(__ANDROID__) && __ANDROID_API__ < 24)
    // Mac & Cygwin & Android API levels 23 and lower doesn't have pwritev().
    while (size > sizeof(ZEROS)) {
      write(offset, ZEROS);
      size -= sizeof(ZEROS);
      offset += sizeof(ZEROS);
    }
    write(offset, kj::arrayPtr(ZEROS, size));
#else
    // Use a 4k buffer of zeros amplified by iov to write zeros with as few syscalls as possible.
    size_t count = (size + sizeof(ZEROS) - 1) / sizeof(ZEROS);
    const size_t iovmax = miniposix::iovMax(count);
    KJ_STACK_ARRAY(struct iovec, iov, kj::min(iovmax, count), 16, 256);

    for (auto& item: iov) {
      item.iov_base = const_cast<byte*>(ZEROS);
      item.iov_len = sizeof(ZEROS);
    }

    while (size > 0) {
      size_t iovCount;
      if (size >= iov.size() * sizeof(ZEROS)) {
        iovCount = iov.size();
      } else {
        iovCount = size / sizeof(ZEROS);
        size_t rem = size % sizeof(ZEROS);
        if (rem > 0) {
          iov[iovCount++].iov_len = rem;
        }
      }

      ssize_t n;
      KJ_SYSCALL(n = pwritev(fd, iov.begin(), count, offset));
      KJ_ASSERT(n > 0, "pwrite() returned zero?");

      offset += n;
      size -= n;
    }
#endif
  }